

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

void __thiscall
Minisat::Solver::shareViaCallback<Minisat::vec<Minisat::Lit>>
          (Solver *this,vec<Minisat::Lit> *v,int lbd)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  uint uVar2;
  int *piVar3;
  Lit *pLVar4;
  pointer piVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if (lbd <= this->core_lbd_cut) {
    iVar1 = v->sz;
    if (iVar1 <= this->share_clause_max_size) {
      bVar11 = this->learnCallback != (_func_void_void_ptr_int_ptr *)0x0;
      bVar6 = iVar1 <= this->learnCallbackLimit;
      if (bVar6 && bVar11) {
        std::vector<int,_std::allocator<int>_>::resize(&this->learnCallbackBuffer,(long)iVar1 + 1);
        lVar8 = (long)v->sz;
        piVar3 = (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < lVar8) {
          pLVar4 = v->data;
          lVar7 = 0;
          do {
            uVar2 = pLVar4[lVar7].x;
            uVar9 = (int)uVar2 >> 1;
            uVar10 = ~uVar9;
            if ((uVar2 & 1) == 0) {
              uVar10 = uVar9 + 1;
            }
            piVar3[lVar7] = uVar10;
            lVar7 = lVar7 + 1;
            lVar8 = (long)v->sz;
          } while (lVar7 < lVar8);
        }
        piVar3[lVar8] = 0;
        (*this->learnCallback)(this->learnCallbackState,piVar3);
      }
      if (((this->share_parallel == true) &&
          (this->learnedClsCallback !=
           (_func_void_vector<int,_std::allocator<int>_>_ptr_int_void_ptr *)0x0)) &&
         (((long)v->sz < 3 || (lbd <= this->core_lbd_cut)))) {
        this_00 = &this->learnCallbackBuffer;
        std::vector<int,_std::allocator<int>_>::resize(this_00,(long)v->sz);
        if ((!bVar6 || !bVar11) && 0 < v->sz) {
          pLVar4 = v->data;
          piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = 0;
          do {
            uVar2 = pLVar4[lVar8].x;
            uVar9 = (int)uVar2 >> 1;
            uVar10 = ~uVar9;
            if ((uVar2 & 1) == 0) {
              uVar10 = uVar9 + 1;
            }
            piVar5[lVar8] = uVar10;
            lVar8 = lVar8 + 1;
          } while (lVar8 < v->sz);
        }
        (*this->learnedClsCallback)(this_00,lbd,this->issuer);
        return;
      }
    }
  }
  return;
}

Assistant:

inline void Solver::shareViaCallback(const V &v, int lbd)
{
    if (lbd > core_lbd_cut) return;
    if (v.size() > share_clause_max_size) return;

    bool filled_buffer = false;

    if (learnCallback != 0 && v.size() <= learnCallbackLimit) {
        learnCallbackBuffer.resize(v.size() + 1);
        for (int i = 0; i < v.size(); i++) {
            Lit lit = v[i];
            learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
        }
        learnCallbackBuffer[v.size()] = 0;
        filled_buffer = true;
        learnCallback(learnCallbackState, &(learnCallbackBuffer[0]));
    }

    /* share only limited clauses in parallel solving! */
    if (share_parallel && learnedClsCallback != 0 && (v.size() < 3 || lbd <= core_lbd_cut)) {
        learnCallbackBuffer.resize(v.size());
        if (!filled_buffer) {
            for (int i = 0; i < v.size(); i++) {
                Lit lit = v[i];
                learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
            }
        }
        learnedClsCallback(learnCallbackBuffer, lbd, issuer);
    }
}